

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalDeclarationStatement.h
# Opt level: O0

void __thiscall LocalDeclarationStatement::execute(LocalDeclarationStatement *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar1;
  shared_ptr<Value> local_38;
  undefined1 local_28 [8];
  ptr<Value> value;
  Environment *env_local;
  LocalDeclarationStatement *this_local;
  
  value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)env;
  peVar1 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expression);
  (**peVar1->_vptr_Expression)
            ((shared_ptr<Value> *)local_28,peVar1,
             value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  this_00 = value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<Value>::shared_ptr(&local_38,(shared_ptr<Value> *)local_28);
  Environment::putValue
            ((Environment *)this_00._M_pi,&this->identifier,Public,&local_38,
             (bool)(this->constant & 1));
  std::shared_ptr<Value>::~shared_ptr(&local_38);
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)local_28);
  return;
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> value = expression->evaluate(env);
        env -> putValue(identifier, Scope::Public, value, constant);
    }